

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlCtxtReadFile(xmlParserCtxtPtr ctxt,char *filename,char *encoding,int options)

{
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options | 0x1000000);
    input = xmlCtxtNewInputFromUrl(ctxt,filename,(char *)0x0,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadFile(xmlParserCtxtPtr ctxt, const char *filename,
                const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    options |= XML_PARSE_UNZIP;

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, encoding, 0);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}